

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void generateSortTail(Parse *pParse,Select *p,Vdbe *v,int nColumn,SelectDest *pDest)

{
  byte bVar1;
  int p1;
  ExprList *pEVar2;
  byte bVar3;
  uint p2;
  uint iContinue;
  int p2_00;
  int iVar4;
  int iVar5;
  long lVar6;
  int p2_01;
  int p1_00;
  int p2_02;
  int local_54;
  
  p2 = sqlite3VdbeMakeLabel(v);
  iContinue = sqlite3VdbeMakeLabel(v);
  pEVar2 = p->pOrderBy;
  bVar1 = pDest->eDest;
  iVar5 = pDest->iSDParm;
  p1 = pEVar2->iECursor;
  if (pParse->nTempReg == '\0') {
    p2_01 = pParse->nMem + 1;
    pParse->nMem = p2_01;
  }
  else {
    bVar3 = pParse->nTempReg - 1;
    pParse->nTempReg = bVar3;
    p2_01 = pParse->aTempReg[bVar3];
  }
  if ((bVar1 == 10) || (bVar1 == 5)) {
    p1_00 = pParse->nTab;
    pParse->nTab = p1_00 + 1;
    sqlite3VdbeAddOp3(v,0x2c,p1_00,p2_01,nColumn);
    p2_00 = 0;
  }
  else {
    if (pParse->nTempReg == '\0') {
      p2_00 = pParse->nMem + 1;
      pParse->nMem = p2_00;
    }
    else {
      bVar3 = pParse->nTempReg - 1;
      pParse->nTempReg = bVar3;
      p2_00 = pParse->aTempReg[bVar3];
    }
    p1_00 = 0;
  }
  if ((p->selFlags & 0x40) == 0) {
    local_54 = sqlite3VdbeAddOp3(v,0x47,p1,p2,0);
    codeOffset(v,p,iContinue);
    sqlite3VdbeAddOp3(v,0x1d,p1,pEVar2->nExpr + 1,p2_01);
  }
  else {
    iVar4 = pParse->nTab;
    p2_02 = pParse->nMem + 1;
    pParse->nMem = p2_02;
    pParse->nTab = iVar4 + 1;
    sqlite3VdbeAddOp3(v,0x2c,iVar4,p2_02,pEVar2->nExpr + 2);
    local_54 = sqlite3VdbeAddOp3(v,0x46,p1,p2,0);
    codeOffset(v,p,iContinue);
    sqlite3VdbeAddOp3(v,0x3e,p1,p2_02,0);
    sqlite3VdbeAddOp3(v,0x1d,iVar4,pEVar2->nExpr + 1,p2_01);
    if (v->aOp != (Op *)0x0) {
      v->aOp[(long)v->nOp + -1].p5 = ' ';
    }
  }
  if (bVar1 - 8 < 2) {
    sqlite3VdbeAddOp3(v,0x38,iVar5,p2_00,0);
    sqlite3VdbeAddOp3(v,0x39,iVar5,p2_01,p2_00);
    if (v->aOp != (Op *)0x0) {
      v->aOp[(long)v->nOp + -1].p5 = '\b';
    }
  }
  else if (bVar1 == 6) {
    sqlite3ExprCodeMove(pParse,p2_01,iVar5,1);
  }
  else if (bVar1 == 7) {
    iVar4 = sqlite3VdbeAddOp3(v,0x1f,p2_01,1,p2_00);
    sqlite3VdbeChangeP4(v,iVar4,&pDest->affSdst,1);
    sqlite3ExprCacheRemove(pParse,p2_01,1);
    sqlite3VdbeAddOp3(v,0x61,iVar5,p2_00,0);
  }
  else {
    if (0 < nColumn) {
      iVar5 = 0;
      do {
        sqlite3VdbeAddOp3(v,0x1d,p1_00,iVar5,pDest->iSdst + iVar5);
        if ((iVar5 == 0) && (v->aOp != (Op *)0x0)) {
          v->aOp[(long)v->nOp + -1].p5 = ' ';
        }
        iVar5 = iVar5 + 1;
      } while (nColumn != iVar5);
    }
    if (bVar1 == 5) {
      sqlite3VdbeAddOp3(v,0x10,pDest->iSdst,nColumn,0);
      sqlite3ExprCacheRemove(pParse,pDest->iSdst,nColumn);
    }
    else {
      sqlite3VdbeAddOp3(v,4,pDest->iSDParm,0,0);
    }
  }
  if (p2_01 != 0) {
    bVar3 = pParse->nTempReg;
    if ((ulong)bVar3 < 8) {
      lVar6 = 0;
      do {
        if (*(int *)((long)&pParse->aColCache[0].iReg + lVar6) == p2_01) {
          (&pParse->aColCache[0].tempReg)[lVar6] = '\x01';
          goto LAB_00191e32;
        }
        lVar6 = lVar6 + 0x18;
      } while ((int)lVar6 != 0xf0);
      pParse->nTempReg = bVar3 + 1;
      pParse->aTempReg[bVar3] = p2_01;
    }
  }
LAB_00191e32:
  if (p2_00 != 0) {
    bVar3 = pParse->nTempReg;
    if ((ulong)bVar3 < 8) {
      lVar6 = 0;
      do {
        if (*(int *)((long)&pParse->aColCache[0].iReg + lVar6) == p2_00) {
          (&pParse->aColCache[0].tempReg)[lVar6] = '\x01';
          goto LAB_00191e6d;
        }
        lVar6 = lVar6 + 0x18;
      } while ((int)lVar6 != 0xf0);
      pParse->nTempReg = bVar3 + 1;
      pParse->aTempReg[bVar3] = p2_00;
    }
  }
LAB_00191e6d:
  if (v->aLabel != (int *)0x0) {
    v->aLabel[(int)~iContinue] = v->nOp;
  }
  iVar5 = 0x51;
  if ((p->selFlags & 0x40) == 0) {
    iVar5 = 0x5f;
  }
  sqlite3VdbeAddOp3(v,iVar5,p1,local_54 + 1,0);
  if (v->aLabel != (int *)0x0) {
    v->aLabel[(int)~p2] = v->nOp;
  }
  if ((bVar1 != 10) && (bVar1 != 5)) {
    return;
  }
  sqlite3VdbeAddOp3(v,0x2d,p1_00,0,0);
  return;
}

Assistant:

static void generateSortTail(
  Parse *pParse,    /* Parsing context */
  Select *p,        /* The SELECT statement */
  Vdbe *v,          /* Generate code into this VDBE */
  int nColumn,      /* Number of columns of data */
  SelectDest *pDest /* Write the sorted results here */
){
  int addrBreak = sqlite3VdbeMakeLabel(v);     /* Jump here to exit loop */
  int addrContinue = sqlite3VdbeMakeLabel(v);  /* Jump here for next cycle */
  int addr;
  int iTab;
  int pseudoTab = 0;
  ExprList *pOrderBy = p->pOrderBy;

  int eDest = pDest->eDest;
  int iParm = pDest->iSDParm;

  int regRow;
  int regRowid;

  iTab = pOrderBy->iECursor;
  regRow = sqlite3GetTempReg(pParse);
  if( eDest==SRT_Output || eDest==SRT_Coroutine ){
    pseudoTab = pParse->nTab++;
    sqlite3VdbeAddOp3(v, OP_OpenPseudo, pseudoTab, regRow, nColumn);
    regRowid = 0;
  }else{
    regRowid = sqlite3GetTempReg(pParse);
  }
  if( p->selFlags & SF_UseSorter ){
    int regSortOut = ++pParse->nMem;
    int ptab2 = pParse->nTab++;
    sqlite3VdbeAddOp3(v, OP_OpenPseudo, ptab2, regSortOut, pOrderBy->nExpr+2);
    addr = 1 + sqlite3VdbeAddOp2(v, OP_SorterSort, iTab, addrBreak);
    codeOffset(v, p, addrContinue);
    sqlite3VdbeAddOp2(v, OP_SorterData, iTab, regSortOut);
    sqlite3VdbeAddOp3(v, OP_Column, ptab2, pOrderBy->nExpr+1, regRow);
    sqlite3VdbeChangeP5(v, OPFLAG_CLEARCACHE);
  }else{
    addr = 1 + sqlite3VdbeAddOp2(v, OP_Sort, iTab, addrBreak);
    codeOffset(v, p, addrContinue);
    sqlite3VdbeAddOp3(v, OP_Column, iTab, pOrderBy->nExpr+1, regRow);
  }
  switch( eDest ){
    case SRT_Table:
    case SRT_EphemTab: {
      testcase( eDest==SRT_Table );
      testcase( eDest==SRT_EphemTab );
      sqlite3VdbeAddOp2(v, OP_NewRowid, iParm, regRowid);
      sqlite3VdbeAddOp3(v, OP_Insert, iParm, regRow, regRowid);
      sqlite3VdbeChangeP5(v, OPFLAG_APPEND);
      break;
    }
#ifndef SQLITE_OMIT_SUBQUERY
    case SRT_Set: {
      assert( nColumn==1 );
      sqlite3VdbeAddOp4(v, OP_MakeRecord, regRow, 1, regRowid,
                        &pDest->affSdst, 1);
      sqlite3ExprCacheAffinityChange(pParse, regRow, 1);
      sqlite3VdbeAddOp2(v, OP_IdxInsert, iParm, regRowid);
      break;
    }
    case SRT_Mem: {
      assert( nColumn==1 );
      sqlite3ExprCodeMove(pParse, regRow, iParm, 1);
      /* The LIMIT clause will terminate the loop for us */
      break;
    }
#endif
    default: {
      int i;
      assert( eDest==SRT_Output || eDest==SRT_Coroutine ); 
      testcase( eDest==SRT_Output );
      testcase( eDest==SRT_Coroutine );
      for(i=0; i<nColumn; i++){
        assert( regRow!=pDest->iSdst+i );
        sqlite3VdbeAddOp3(v, OP_Column, pseudoTab, i, pDest->iSdst+i);
        if( i==0 ){
          sqlite3VdbeChangeP5(v, OPFLAG_CLEARCACHE);
        }
      }
      if( eDest==SRT_Output ){
        sqlite3VdbeAddOp2(v, OP_ResultRow, pDest->iSdst, nColumn);
        sqlite3ExprCacheAffinityChange(pParse, pDest->iSdst, nColumn);
      }else{
        sqlite3VdbeAddOp1(v, OP_Yield, pDest->iSDParm);
      }
      break;
    }
  }
  sqlite3ReleaseTempReg(pParse, regRow);
  sqlite3ReleaseTempReg(pParse, regRowid);

  /* The bottom of the loop
  */
  sqlite3VdbeResolveLabel(v, addrContinue);
  if( p->selFlags & SF_UseSorter ){
    sqlite3VdbeAddOp2(v, OP_SorterNext, iTab, addr);
  }else{
    sqlite3VdbeAddOp2(v, OP_Next, iTab, addr);
  }
  sqlite3VdbeResolveLabel(v, addrBreak);
  if( eDest==SRT_Output || eDest==SRT_Coroutine ){
    sqlite3VdbeAddOp2(v, OP_Close, pseudoTab, 0);
  }
}